

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SuperH.cpp
# Opt level: O1

unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> __thiscall
CShArchitecture::parseOpcode(CShArchitecture *this,Parser *parser)

{
  undefined8 uVar1;
  ShParser shParser;
  undefined1 local_c8 [120];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_50;
  undefined1 local_48;
  
  local_c8._40_8_ = 0;
  local_c8._24_8_ = 0;
  local_c8._32_8_ = 0;
  local_c8._88_8_ = 0;
  local_c8._72_8_ = 0;
  local_c8._80_8_ = 0;
  local_c8._112_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Stack_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48 = 1;
  local_c8._16_8_ = local_c8 + 0x20;
  local_c8._64_8_ = (long)local_c8 + 0x50U;
  ShParser::parseOpcode((ShParser *)local_c8,(Parser *)(local_c8 + 8));
  uVar1 = local_c8._0_8_;
  local_c8._0_8_ = 0;
  (this->super_Architecture)._vptr_Architecture = (_func_int **)uVar1;
  if (p_Stack_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_50);
  }
  if (local_c8._64_8_ != (long)local_c8 + 0x50U) {
    operator_delete((void *)local_c8._64_8_,local_c8._80_8_ + 1);
  }
  if ((undefined1 *)local_c8._16_8_ != local_c8 + 0x20) {
    operator_delete((void *)local_c8._16_8_,local_c8._32_8_ + 1);
  }
  return (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         (__uniq_ptr_data<CAssemblerCommand,_std::default_delete<CAssemblerCommand>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CAssemblerCommand> CShArchitecture::parseOpcode(Parser& parser)
{
	ShParser shParser;
	return shParser.parseOpcode(parser);
}